

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

size_t wasm::anon_unknown_0::shapeHash(Type a)

{
  pointer pTVar1;
  Exactness EVar2;
  Tuple *pTVar3;
  size_t sVar4;
  HeapType HVar5;
  ulong uVar6;
  const_iterator __end2;
  const_iterator __begin2;
  pointer pTVar7;
  Type local_30;
  Type a_local;
  
  local_30.id = a.id;
  if ((a.id & 1) == 0 || a.id < 7) {
    if ((a.id & 1) == 0 && 6 < a.id) {
      HVar5 = wasm::Type::getHeapType(&local_30);
      if (HVar5.id < 0x7d) {
        HVar5 = wasm::Type::getHeapType(&local_30);
        sVar4 = HVar5.id + 0x1fb68949c000b4d6 ^ 0x9e3779b97f4a8c19;
      }
      else {
        uVar6 = 0x8181f0f0bf4a28cf;
        if (((uint)local_30.id & 3) != 2) {
          uVar6 = 0x8181f0f0bf4a28ce;
        }
        if (local_30.id < 7) {
          uVar6 = 0x8181f0f0bf4a28ce;
        }
        EVar2 = wasm::Type::getExactness(&local_30);
        sVar4 = (long)(int)EVar2 + -0x59b0673774c0e15f + uVar6 * 0x1000 ^ uVar6;
      }
    }
    else {
      sVar4 = 0x9e3779b97f4a8c16;
    }
  }
  else {
    pTVar3 = wasm::Type::getTuple(&local_30);
    pTVar7 = (pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (pTVar3->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = (long)pTVar1 - (long)pTVar7 >> 3;
    for (; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
      sVar4 = shapeHash((Type)pTVar7->id);
      uVar6 = uVar6 ^ uVar6 * 0x1000 + -0x61c8864680b583eb + (uVar6 >> 4) + sVar4;
    }
    sVar4 = uVar6 + 0x9e3779b97f4a7c15;
  }
  return sVar4;
}

Assistant:

size_t shapeHash(Type a) {
  if (a.isTuple()) {
    auto digest = hash(0);
    hash_combine(digest, shapeHash(a.getTuple()));
    return digest;
  }
  auto digest = hash(1);
  if (!a.isRef()) {
    rehash(digest, 2);
    return digest;
  }
  if (a.getHeapType().isBasic()) {
    rehash(digest, 3);
    rehash(digest, a.getHeapType().getID());
    return digest;
  }
  rehash(digest, 4);
  rehash(digest, (int)a.getNullability());
  rehash(digest, (int)a.getExactness());
  return digest;
}